

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O3

bool __thiscall
google::protobuf::Reflection::IsSingularFieldNonEmpty
          (Reflection *this,Message *message,FieldDescriptor *field)

{
  bool bVar1;
  byte bVar2;
  CppStringType CVar3;
  float *pfVar4;
  bool *pbVar5;
  double *pdVar6;
  Cord *pCVar7;
  InlinedStringField *pIVar8;
  ArenaStringPtr *pAVar9;
  ulong uVar10;
  size_t sVar11;
  
  if (((field->containing_type_ == (Descriptor *)0x0) ||
      ((field->containing_type_->options_->field_0)._impl_.map_entry_ == false)) &&
     (bVar1 = FieldDescriptor::has_presence(field), bVar1)) {
LAB_001f6058:
    IsSingularFieldNonEmpty();
LAB_001f6060:
    IsSingularFieldNonEmpty();
  }
  bVar2 = field->field_0x1;
  if (0xbf < bVar2 != (bool)((bVar2 & 0x20) >> 5)) {
    IsSingularFieldNonEmpty();
LAB_001f6040:
    IsSingularFieldNonEmpty();
LAB_001f6048:
    IsSingularFieldNonEmpty();
switchD_001f5f29_caseD_a:
    IsSingularFieldNonEmpty();
    goto LAB_001f6058;
  }
  if ((bVar2 & 0x20) != 0) goto LAB_001f6040;
  bVar2 = field->type_;
  if (bVar2 == 0xb) {
    bVar1 = FieldDescriptor::is_map_message_type(field);
    if (!bVar1) {
      bVar2 = field->type_;
      goto LAB_001f5f03;
    }
    goto LAB_001f6048;
  }
LAB_001f5f03:
  switch(*(undefined4 *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)bVar2 * 4)) {
  case 1:
  case 8:
    pfVar4 = (float *)GetRaw<int>(this,message,field);
    break;
  case 2:
    pdVar6 = (double *)GetRaw<long>(this,message,field);
    goto LAB_001f5f8b;
  case 3:
    pfVar4 = (float *)GetRaw<unsigned_int>(this,message,field);
    break;
  case 4:
    pdVar6 = (double *)GetRaw<unsigned_long>(this,message,field);
    goto LAB_001f5f8b;
  case 5:
    pdVar6 = GetRaw<double>(this,message,field);
LAB_001f5f8b:
    bVar1 = *pdVar6 == 0.0;
    goto LAB_001f5fa2;
  case 6:
    pfVar4 = GetRaw<float>(this,message,field);
    break;
  case 7:
    pbVar5 = GetRaw<bool>(this,message,field);
    return *pbVar5;
  case 9:
    CVar3 = FieldDescriptor::cpp_string_type(field);
    if ((CVar3 != kView) && (CVar3 != kString)) {
      if (CVar3 != kCord) goto LAB_001f6060;
      pCVar7 = GetRaw<absl::lts_20250127::Cord_const>(this,message,field);
      uVar10 = (ulong)(pCVar7->contents_).data_.rep_.field_0.data[0];
      if ((uVar10 & 1) == 0) {
        sVar11 = uVar10 >> 1;
      }
      else {
        sVar11 = ((pCVar7->contents_).data_.rep_.field_0.as_tree.rep)->length;
      }
      bVar1 = sVar11 == 0;
      goto LAB_001f5fa2;
    }
    goto LAB_001f5feb;
  case 10:
    goto switchD_001f5f29_caseD_a;
  default:
    IsSingularFieldNonEmpty();
LAB_001f5feb:
    bVar1 = internal::ReflectionSchema::IsFieldInlined(&this->schema_,field);
    if (bVar1) {
      pIVar8 = GetRaw<google::protobuf::internal::InlinedStringField>(this,message,field);
    }
    else {
      pAVar9 = GetRaw<google::protobuf::internal::ArenaStringPtr>(this,message,field);
      pIVar8 = (InlinedStringField *)((ulong)(pAVar9->tagged_ptr_).ptr_ & 0xfffffffffffffffc);
    }
    bVar1 = (pIVar8->field_0).str_._M_string_length == 0;
    goto LAB_001f5fa2;
  }
  bVar1 = *pfVar4 == 0.0;
LAB_001f5fa2:
  return !bVar1;
}

Assistant:

bool Reflection::IsSingularFieldNonEmpty(const Message& message,
                                         const FieldDescriptor* field) const {
  ABSL_DCHECK(IsMapEntry(field) || !field->has_presence());
  ABSL_DCHECK(!field->is_repeated());
  ABSL_DCHECK(!field->is_map());
  ABSL_DCHECK(field->cpp_type() != FieldDescriptor::CPPTYPE_MESSAGE);
  // Scalar primitive (numeric or string/bytes) fields are present if
  // their value is non-zero (numeric) or non-empty (string/bytes). N.B.:
  // we must use this definition here, rather than the "scalar fields
  // always present" in the proto3 docs, because MergeFrom() semantics
  // require presence as "present on wire", and reflection-based merge
  // (which uses HasField()) needs to be consistent with this.
  switch (field->cpp_type()) {
    case FieldDescriptor::CPPTYPE_BOOL:
      return GetRaw<bool>(message, field) != false;
    case FieldDescriptor::CPPTYPE_INT32:
      return GetRaw<int32_t>(message, field) != 0;
    case FieldDescriptor::CPPTYPE_INT64:
      return GetRaw<int64_t>(message, field) != 0;
    case FieldDescriptor::CPPTYPE_UINT32:
      return GetRaw<uint32_t>(message, field) != 0;
    case FieldDescriptor::CPPTYPE_UINT64:
      return GetRaw<uint64_t>(message, field) != 0;
    case FieldDescriptor::CPPTYPE_FLOAT:
      static_assert(sizeof(uint32_t) == sizeof(float),
                    "Code assumes uint32_t and float are the same size.");
      return absl::bit_cast<uint32_t>(GetRaw<float>(message, field)) != 0;
    case FieldDescriptor::CPPTYPE_DOUBLE:
      static_assert(sizeof(uint64_t) == sizeof(double),
                    "Code assumes uint64_t and double are the same size.");
      return absl::bit_cast<uint64_t>(GetRaw<double>(message, field)) != 0;
    case FieldDescriptor::CPPTYPE_ENUM:
      return GetRaw<int>(message, field) != 0;
    case FieldDescriptor::CPPTYPE_STRING:
      switch (field->cpp_string_type()) {
        case FieldDescriptor::CppStringType::kCord:
          return !GetField<const absl::Cord>(message, field).empty();
        case FieldDescriptor::CppStringType::kView:
        case FieldDescriptor::CppStringType::kString: {
          if (IsInlined(field)) {
            return !GetField<InlinedStringField>(message, field)
                        .GetNoArena()
                        .empty();
          } else if (IsMicroString(field)) {
            return !GetField<MicroString>(message, field).Get().empty();
          }

          return !GetField<ArenaStringPtr>(message, field).Get().empty();
        }
        default:
          internal::Unreachable();
      }
    case FieldDescriptor::CPPTYPE_MESSAGE:
    default:
      internal::Unreachable();
  }
}